

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeblock.cpp
# Opt level: O0

CodeBlock * __thiscall cppgenerate::CodeBlock::operator<<(CodeBlock *this,CodeBlock *other)

{
  string local_38 [32];
  CodeBlock *local_18;
  CodeBlock *other_local;
  CodeBlock *this_local;
  
  local_18 = other;
  other_local = this;
  std::__cxx11::ostringstream::str();
  std::operator<<((ostream *)this,local_38);
  std::__cxx11::string::~string(local_38);
  return this;
}

Assistant:

CodeBlock& CodeBlock::operator<<( const CodeBlock& other ){
    m_text << other.m_text.str();

    return *this;
}